

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O2

void __thiscall UnitTest_lex5::UnitTest_lex5(UnitTest_lex5 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_001968b0;
  std::__cxx11::string::assign((char *)&(this->super_UnitTestBase).test_name_);
  return;
}

Assistant:

TEST_CASE(lex5)
{
    LexerWrapper lexer("+ - * / % ^ # == ~= <= >= < > = ( ) { } [ ] ; : , . .. ...");
    EXPECT_TRUE(lexer.GetToken() == '+');
    EXPECT_TRUE(lexer.GetToken() == '-');
    EXPECT_TRUE(lexer.GetToken() == '*');
    EXPECT_TRUE(lexer.GetToken() == '/');
    EXPECT_TRUE(lexer.GetToken() == '%');
    EXPECT_TRUE(lexer.GetToken() == '^');
    EXPECT_TRUE(lexer.GetToken() == '#');
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Equal);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_NotEqual);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_LessEqual);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_GreaterEqual);
    EXPECT_TRUE(lexer.GetToken() == '<');
    EXPECT_TRUE(lexer.GetToken() == '>');
    EXPECT_TRUE(lexer.GetToken() == '=');
    EXPECT_TRUE(lexer.GetToken() == '(');
    EXPECT_TRUE(lexer.GetToken() == ')');
    EXPECT_TRUE(lexer.GetToken() == '{');
    EXPECT_TRUE(lexer.GetToken() == '}');
    EXPECT_TRUE(lexer.GetToken() == '[');
    EXPECT_TRUE(lexer.GetToken() == ']');
    EXPECT_TRUE(lexer.GetToken() == ';');
    EXPECT_TRUE(lexer.GetToken() == ':');
    EXPECT_TRUE(lexer.GetToken() == ',');
    EXPECT_TRUE(lexer.GetToken() == '.');
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Concat);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_VarArg);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}